

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O0

REF_STATUS ref_mpi_allminwho(REF_MPI ref_mpi,REF_DBL *val,REF_INT *who,REF_INT n)

{
  int local_30;
  REF_INT i;
  REF_INT n_local;
  REF_INT *who_local;
  REF_DBL *val_local;
  REF_MPI ref_mpi_local;
  
  if (ref_mpi->n < 2) {
    for (local_30 = 0; local_30 < n; local_30 = local_30 + 1) {
      who[local_30] = ref_mpi->id;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_allminwho(REF_MPI ref_mpi, REF_DBL *val,
                                     REF_INT *who, REF_INT n) {
  REF_INT i;
  if (!ref_mpi_para(ref_mpi)) {
    for (i = 0; i < n; i++) who[i] = ref_mpi_rank(ref_mpi);
    return REF_SUCCESS;
  }
#ifdef HAVE_MPI
  {
    typedef struct REF_MPI_DBLWHO REF_MPI_DBLWHO;
    struct REF_MPI_DBLWHO {
      double val;
      int rank;
    };
    REF_MPI_DBLWHO *in, *out;
    ref_malloc(in, n, REF_MPI_DBLWHO);
    ref_malloc(out, n, REF_MPI_DBLWHO);

    for (i = 0; i < n; i++) {
      in[i].val = val[i];
      in[i].rank = ref_mpi_rank(ref_mpi);
    }
    ref_mpi_where_am_i(ref_mpi);
    if (ref_mpi_debugging(ref_mpi)) printf("MPI_MINLOC %d\n", n);
    MPI_Allreduce(in, out, n, MPI_DOUBLE_INT, MPI_MINLOC,
                  ref_mpi_comm(ref_mpi));
    for (i = 0; i < n; i++) {
      val[i] = out[i].val;
      who[i] = out[i].rank;
    }

    ref_free(out);
    ref_free(in);
  }
#else
  SUPRESS_UNUSED_COMPILER_WARNING(val);
#endif
  return REF_SUCCESS;
}